

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

PivotColumnEntry *
duckdb::PivotColumnEntry::Deserialize
          (PivotColumnEntry *__return_storage_ptr__,Deserializer *deserializer)

{
  (__return_storage_ptr__->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->expr).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  (__return_storage_ptr__->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->alias)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->alias).field_2;
  (__return_storage_ptr__->alias)._M_string_length = 0;
  (__return_storage_ptr__->alias).field_2._M_local_buf[0] = '\0';
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::Value,true>>
            (deserializer,100,"values",&__return_storage_ptr__->values);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,0x65,"star_expr",&__return_storage_ptr__->expr);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0x66,"alias",&__return_storage_ptr__->alias);
  return __return_storage_ptr__;
}

Assistant:

PivotColumnEntry PivotColumnEntry::Deserialize(Deserializer &deserializer) {
	PivotColumnEntry result;
	deserializer.ReadPropertyWithDefault<vector<Value>>(100, "values", result.values);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(101, "star_expr", result.expr);
	deserializer.ReadPropertyWithDefault<string>(102, "alias", result.alias);
	return result;
}